

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::Image::operator==(Image *this,Image *other)

{
  bool bVar1;
  __type _Var2;
  long in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  bool local_11;
  Value *__rhs;
  
  local_11 = false;
  if ((*(int *)&(in_RDI->array_value_).
                super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
                super__Vector_impl_data._M_finish == *(int *)(in_RSI + 0x50)) &&
     (local_11 = false,
     *(int *)((long)&(in_RDI->string_value_).field_2 + 8) == *(int *)(in_RSI + 0x28))) {
    __rhs = in_RDI;
    bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar1) {
      bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if ((bVar1) &&
         (local_11 = false,
         *(int *)((long)&(in_RDI->string_value_).field_2 + 4) == *(int *)(in_RSI + 0x24))) {
        bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                unaff_retaddr,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__rhs);
        local_11 = false;
        if (bVar1) {
          _Var2 = std::operator==(unaff_retaddr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          local_11 = false;
          if (_Var2) {
            _Var2 = std::operator==(unaff_retaddr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
            local_11 = false;
            if (_Var2) {
              _Var2 = std::operator==(unaff_retaddr,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__rhs);
              local_11 = false;
              if (_Var2) {
                local_11 = *(int *)&(in_RDI->string_value_).field_2 == *(int *)(in_RSI + 0x20);
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Image::operator==(const Image &other) const {
  return this->bufferView == other.bufferView &&
         this->component == other.component &&
         this->extensions == other.extensions && this->extras == other.extras &&
         this->height == other.height && this->image == other.image &&
         this->mimeType == other.mimeType && this->name == other.name &&
         this->uri == other.uri && this->width == other.width;
}